

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ulong *puVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  undefined8 unaff_R12;
  ulong uVar38;
  Geometry *geometry;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  float fVar60;
  float fVar64;
  float fVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  undefined1 auVar63 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  float fVar74;
  float fVar76;
  float fVar77;
  undefined1 auVar75 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar81;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar82 [32];
  float fVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [564];
  ulong *local_1628;
  undefined1 local_1600 [16];
  ulong *local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  ulong local_15c8;
  ulong local_15c0;
  ulong local_15b8;
  ulong local_15b0;
  ulong local_15a8;
  ulong local_15a0;
  ulong local_1598;
  ulong local_1590;
  long local_1588;
  long local_1580;
  long local_1578;
  undefined1 local_1570 [16];
  RTCFilterFunctionNArguments local_1560;
  undefined1 local_1530 [16];
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined4 local_13f0;
  undefined4 uStack_13ec;
  undefined4 uStack_13e8;
  undefined4 uStack_13e4;
  undefined4 local_13e0;
  undefined4 uStack_13dc;
  undefined4 uStack_13d8;
  undefined4 uStack_13d4;
  undefined4 local_13d0;
  undefined4 uStack_13cc;
  undefined4 uStack_13c8;
  undefined4 uStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float local_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined1 local_1390 [16];
  uint local_1380;
  uint uStack_137c;
  uint uStack_1378;
  uint uStack_1374;
  undefined1 auStack_1370 [16];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  byte local_12df;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  uint uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar91 = ZEXT3264(auVar43);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar92 = ZEXT3264(auVar44);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar93 = ZEXT3264(auVar45);
  auVar40 = vmulss_avx512f(auVar43._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar41 = vmulss_avx512f(auVar44._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar44._0_4_ = auVar40._0_4_;
  auVar44._4_4_ = auVar44._0_4_;
  auVar44._8_4_ = auVar44._0_4_;
  auVar44._12_4_ = auVar44._0_4_;
  auVar44._16_4_ = auVar44._0_4_;
  auVar44._20_4_ = auVar44._0_4_;
  auVar44._24_4_ = auVar44._0_4_;
  auVar44._28_4_ = auVar44._0_4_;
  auVar46._0_4_ = auVar41._0_4_;
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar46._16_4_ = auVar46._0_4_;
  auVar46._20_4_ = auVar46._0_4_;
  auVar46._24_4_ = auVar46._0_4_;
  auVar46._28_4_ = auVar46._0_4_;
  auVar40 = vmulss_avx512f(auVar45._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar45._0_4_ = auVar40._0_4_;
  auVar45._4_4_ = auVar45._0_4_;
  auVar45._8_4_ = auVar45._0_4_;
  auVar45._12_4_ = auVar45._0_4_;
  auVar45._16_4_ = auVar45._0_4_;
  auVar45._20_4_ = auVar45._0_4_;
  auVar45._24_4_ = auVar45._0_4_;
  auVar45._28_4_ = auVar45._0_4_;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar35 = uVar32 ^ 0x20;
  uVar36 = uVar33 ^ 0x20;
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar94 = ZEXT3264(auVar43);
  uVar39 = uVar34 ^ 0x20;
  auVar44 = vxorps_avx512vl(auVar44,auVar43);
  auVar95 = ZEXT3264(auVar44);
  auVar44 = vxorps_avx512vl(auVar46,auVar43);
  auVar96 = ZEXT3264(auVar44);
  auVar43 = vxorps_avx512vl(auVar45,auVar43);
  auVar97 = ZEXT3264(auVar43);
  auVar43 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar98 = ZEXT3264(auVar43);
  auVar43 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar99 = ZEXT3264(auVar43);
  local_1590 = uVar32 >> 2;
  local_1598 = uVar35 >> 2;
  local_15a0 = uVar33 >> 2;
  local_15a8 = uVar36 >> 2;
  local_15b0 = uVar34 >> 2;
  local_15b8 = uVar39 >> 2;
  auVar40 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar100 = ZEXT1664(auVar40);
  auVar40 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar101 = ZEXT1664(auVar40);
  puVar25 = local_11f8;
  local_15e8 = uVar39;
  local_15e0 = uVar36;
  local_15d8 = uVar35;
  local_15d0 = uVar34;
  local_15c8 = uVar33;
  local_15c0 = uVar32;
LAB_01dca338:
  do {
    local_15f0 = puVar25;
    if (local_15f0 == &local_1200) {
LAB_01dcadd6:
      return local_15f0 != &local_1200;
    }
    local_1628 = local_15f0 + -1;
    uVar38 = local_15f0[-1];
    while ((uVar38 & 8) == 0) {
      auVar43 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar32),auVar95._0_32_,
                           auVar91._0_32_);
      auVar44 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar33),auVar96._0_32_,
                           auVar92._0_32_);
      auVar43 = vpmaxsd_avx2(auVar43,auVar44);
      auVar45 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar34),auVar97._0_32_,
                           auVar93._0_32_);
      auVar44 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar35),auVar95._0_32_,
                           auVar91._0_32_);
      auVar46 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar36),auVar96._0_32_,
                           auVar92._0_32_);
      auVar44 = vpminsd_avx2(auVar44,auVar46);
      auVar46 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar39),auVar97._0_32_,
                           auVar93._0_32_);
      auVar45 = vpmaxsd_avx512vl(auVar45,auVar98._0_32_);
      auVar43 = vpmaxsd_avx2(auVar43,auVar45);
      auVar45 = vpminsd_avx512vl(auVar46,auVar99._0_32_);
      auVar44 = vpminsd_avx2(auVar44,auVar45);
      uVar29 = vpcmpd_avx512vl(auVar43,auVar44,2);
      puVar25 = local_1628;
      if ((char)uVar29 == '\0') goto LAB_01dca338;
      uVar26 = uVar38 & 0xfffffffffffffff0;
      lVar27 = 0;
      for (uVar38 = uVar29; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar38 = *(ulong *)(uVar26 + lVar27 * 8);
      uVar28 = (uint)uVar29 - 1 & (uint)uVar29;
      uVar29 = (ulong)uVar28;
      if (uVar28 != 0) {
        do {
          *local_1628 = uVar38;
          local_1628 = local_1628 + 1;
          lVar27 = 0;
          for (uVar38 = uVar29; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar29 = uVar29 - 1 & uVar29;
          uVar38 = *(ulong *)(uVar26 + lVar27 * 8);
        } while (uVar29 != 0);
      }
    }
    local_1588 = (ulong)((uint)uVar38 & 0xf) - 8;
    uVar38 = uVar38 & 0xfffffffffffffff0;
    for (local_1580 = 0; puVar25 = local_1628, local_1580 != local_1588; local_1580 = local_1580 + 1
        ) {
      lVar27 = local_1580 * 0x90;
      local_1578 = lVar27 + uVar38;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(ulong *)(uVar38 + 0x40 + lVar27);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(ulong *)(uVar38 + 0x48 + lVar27);
      uVar16 = vpcmpub_avx512vl(auVar57,auVar61,2);
      uVar1 = *(undefined4 *)(uVar38 + 0x70 + lVar27);
      auVar56._4_4_ = uVar1;
      auVar56._0_4_ = uVar1;
      auVar56._8_4_ = uVar1;
      auVar56._12_4_ = uVar1;
      auVar56._16_4_ = uVar1;
      auVar56._20_4_ = uVar1;
      auVar56._24_4_ = uVar1;
      auVar56._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar38 + 0x7c + lVar27);
      auVar49._4_4_ = uVar1;
      auVar49._0_4_ = uVar1;
      auVar49._8_4_ = uVar1;
      auVar49._12_4_ = uVar1;
      auVar49._16_4_ = uVar1;
      auVar49._20_4_ = uVar1;
      auVar49._24_4_ = uVar1;
      auVar49._28_4_ = uVar1;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(local_1590 + 0x40 + local_1578);
      auVar43 = vpmovzxbd_avx2(auVar40);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar40 = vfmadd213ps_fma(auVar43,auVar49,auVar56);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *(ulong *)(local_1598 + 0x40 + local_1578);
      auVar43 = vpmovzxbd_avx2(auVar41);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar41 = vfmadd213ps_fma(auVar43,auVar49,auVar56);
      uVar1 = *(undefined4 *)(uVar38 + 0x74 + lVar27);
      auVar55._4_4_ = uVar1;
      auVar55._0_4_ = uVar1;
      auVar55._8_4_ = uVar1;
      auVar55._12_4_ = uVar1;
      auVar55._16_4_ = uVar1;
      auVar55._20_4_ = uVar1;
      auVar55._24_4_ = uVar1;
      auVar55._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar38 + 0x80 + lVar27);
      auVar51._4_4_ = uVar1;
      auVar51._0_4_ = uVar1;
      auVar51._8_4_ = uVar1;
      auVar51._12_4_ = uVar1;
      auVar51._16_4_ = uVar1;
      auVar51._20_4_ = uVar1;
      auVar51._24_4_ = uVar1;
      auVar51._28_4_ = uVar1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(local_15a0 + 0x40 + local_1578);
      auVar43 = vpmovzxbd_avx2(auVar2);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar2 = vfmadd213ps_fma(auVar43,auVar51,auVar55);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(local_15a8 + 0x40 + local_1578);
      auVar43 = vpmovzxbd_avx2(auVar3);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar3 = vfmadd213ps_fma(auVar43,auVar51,auVar55);
      uVar1 = *(undefined4 *)(uVar38 + 0x78 + lVar27);
      auVar50._4_4_ = uVar1;
      auVar50._0_4_ = uVar1;
      auVar50._8_4_ = uVar1;
      auVar50._12_4_ = uVar1;
      auVar50._16_4_ = uVar1;
      auVar50._20_4_ = uVar1;
      auVar50._24_4_ = uVar1;
      auVar50._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar38 + 0x84 + lVar27);
      auVar47._4_4_ = uVar1;
      auVar47._0_4_ = uVar1;
      auVar47._8_4_ = uVar1;
      auVar47._12_4_ = uVar1;
      auVar47._16_4_ = uVar1;
      auVar47._20_4_ = uVar1;
      auVar47._24_4_ = uVar1;
      auVar47._28_4_ = uVar1;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(local_15b0 + 0x40 + local_1578);
      auVar43 = vpmovzxbd_avx2(auVar4);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar4 = vfmadd213ps_fma(auVar43,auVar47,auVar50);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(local_15b8 + 0x40 + local_1578);
      auVar43 = vpmovzxbd_avx2(auVar5);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar5 = vfmadd213ps_fma(auVar43,auVar47,auVar50);
      auVar43 = vfmadd213ps_avx512vl(ZEXT1632(auVar40),auVar91._0_32_,auVar95._0_32_);
      auVar44 = vfmadd213ps_avx512vl(ZEXT1632(auVar2),auVar92._0_32_,auVar96._0_32_);
      auVar43 = vpmaxsd_avx2(auVar43,auVar44);
      auVar45 = vfmadd213ps_avx512vl(ZEXT1632(auVar4),auVar93._0_32_,auVar97._0_32_);
      auVar44 = vfmadd213ps_avx512vl(ZEXT1632(auVar41),auVar91._0_32_,auVar95._0_32_);
      auVar46 = vfmadd213ps_avx512vl(ZEXT1632(auVar3),auVar92._0_32_,auVar96._0_32_);
      auVar44 = vpminsd_avx2(auVar44,auVar46);
      auVar46 = vfmadd213ps_avx512vl(ZEXT1632(auVar5),auVar93._0_32_,auVar97._0_32_);
      auVar45 = vpmaxsd_avx512vl(auVar45,auVar98._0_32_);
      auVar43 = vpmaxsd_avx2(auVar43,auVar45);
      auVar45 = vpminsd_avx512vl(auVar46,auVar99._0_32_);
      auVar44 = vpminsd_avx2(auVar44,auVar45);
      uVar17 = vpcmpd_avx512vl(auVar43,auVar44,2);
      for (uVar32 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),
                             (uint)(byte)((byte)uVar16 & (byte)uVar17)); uVar32 != 0;
          uVar32 = uVar32 - 1 & uVar32) {
        lVar27 = 0;
        for (uVar33 = uVar32; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          lVar27 = lVar27 + 1;
        }
        pGVar6 = (context->scene->geometries).items[*(uint *)(local_1578 + 0x88)].ptr;
        lVar7 = *(long *)&pGVar6->field_0x58;
        lVar8 = *(long *)&pGVar6[1].time_range.upper;
        lVar31 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (ulong)*(uint *)(local_1578 + 4 + lVar27 * 8);
        uVar33 = *(ulong *)(local_1578 + lVar27 * 8);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uVar33;
        auVar40 = vpandq_avx512vl(auVar58,auVar100._0_16_);
        auVar5 = vpmovzxwd_avx(auVar40);
        auVar62._8_8_ = 0;
        auVar62._0_8_ = *(ulong *)(lVar7 + lVar31);
        auVar40 = vpaddd_avx(auVar62,auVar5);
        auVar41 = vpmulld_avx(auVar62,auVar5);
        auVar41 = vpsrlq_avx(auVar41,0x20);
        auVar40 = vpaddd_avx(auVar40,auVar41);
        lVar30 = CONCAT44((int)((ulong)local_1578 >> 0x20),auVar40._0_4_);
        p_Var9 = pGVar6[1].intersectionFilterN;
        auVar40 = *(undefined1 (*) [16])(lVar8 + (lVar30 + 1) * (long)p_Var9);
        uVar35 = *(ulong *)(lVar7 + lVar31) >> 0x20;
        lVar37 = lVar30 + uVar35 + 1;
        auVar41 = *(undefined1 (*) [16])(lVar8 + (lVar30 + uVar35) * (long)p_Var9);
        auVar2 = *(undefined1 (*) [16])(lVar8 + lVar37 * (long)p_Var9);
        uVar34 = (ulong)(-1 < (short)uVar33);
        auVar3 = *(undefined1 (*) [16])(lVar8 + (lVar30 + uVar34 + 1) * (long)p_Var9);
        lVar27 = uVar34 + lVar37;
        auVar4 = *(undefined1 (*) [16])(lVar8 + lVar27 * (long)p_Var9);
        uVar34 = 0;
        if (-1 < (short)(uVar33 >> 0x10)) {
          uVar34 = uVar35;
        }
        auVar57 = *(undefined1 (*) [16])(lVar8 + (lVar30 + uVar35 + uVar34) * (long)p_Var9);
        auVar61 = *(undefined1 (*) [16])(lVar8 + (lVar37 + uVar34) * (long)p_Var9);
        auVar78._16_16_ = *(undefined1 (*) [16])(lVar8 + (uVar34 + lVar27) * (long)p_Var9);
        auVar78._0_16_ = auVar2;
        auVar62 = vunpcklps_avx(auVar40,auVar4);
        auVar58 = vunpckhps_avx(auVar40,auVar4);
        auVar11 = vunpcklps_avx(auVar3,auVar2);
        auVar3 = vunpckhps_avx(auVar3,auVar2);
        auVar42 = vunpcklps_avx(auVar58,auVar3);
        auVar12 = vunpcklps_avx(auVar62,auVar11);
        auVar3 = vunpckhps_avx(auVar62,auVar11);
        auVar62 = vunpcklps_avx(auVar41,auVar61);
        auVar58 = vunpckhps_avx(auVar41,auVar61);
        auVar11 = vunpcklps_avx(auVar2,auVar57);
        auVar57 = vunpckhps_avx(auVar2,auVar57);
        auVar58 = vunpcklps_avx(auVar58,auVar57);
        auVar13 = vunpcklps_avx(auVar62,auVar11);
        auVar57 = vunpckhps_avx(auVar62,auVar11);
        auVar70._16_16_ = auVar61;
        auVar70._0_16_ = auVar41;
        auVar67._16_16_ = auVar4;
        auVar67._0_16_ = auVar40;
        auVar43 = vunpcklps_avx(auVar67,auVar70);
        auVar63._16_16_ = auVar2;
        auVar63._0_16_ = *(undefined1 (*) [16])(lVar8 + (long)p_Var9 * lVar30);
        auVar44 = vunpcklps_avx(auVar63,auVar78);
        auVar49 = vunpcklps_avx(auVar44,auVar43);
        auVar50 = vunpckhps_avx(auVar44,auVar43);
        auVar43 = vunpckhps_avx(auVar67,auVar70);
        auVar44 = vunpckhps_avx(auVar63,auVar78);
        auVar51 = vunpcklps_avx(auVar44,auVar43);
        auVar43._16_16_ = auVar12;
        auVar43._0_16_ = auVar12;
        auVar68._16_16_ = auVar3;
        auVar68._0_16_ = auVar3;
        auVar71._16_16_ = auVar42;
        auVar71._0_16_ = auVar42;
        auVar72._16_16_ = auVar13;
        auVar72._0_16_ = auVar13;
        auVar79._16_16_ = auVar57;
        auVar79._0_16_ = auVar57;
        auVar73._16_16_ = auVar58;
        auVar73._0_16_ = auVar58;
        auVar43 = vsubps_avx(auVar49,auVar43);
        auVar44 = vsubps_avx(auVar50,auVar68);
        auVar45 = vsubps_avx(auVar51,auVar71);
        auVar46 = vsubps_avx(auVar72,auVar49);
        auVar56 = vsubps_avx(auVar79,auVar50);
        auVar55 = vsubps_avx(auVar73,auVar51);
        auVar20._4_4_ = auVar44._4_4_ * auVar55._4_4_;
        auVar20._0_4_ = auVar44._0_4_ * auVar55._0_4_;
        auVar20._8_4_ = auVar44._8_4_ * auVar55._8_4_;
        auVar20._12_4_ = auVar44._12_4_ * auVar55._12_4_;
        auVar20._16_4_ = auVar44._16_4_ * auVar55._16_4_;
        auVar20._20_4_ = auVar44._20_4_ * auVar55._20_4_;
        auVar20._24_4_ = auVar44._24_4_ * auVar55._24_4_;
        auVar20._28_4_ = auVar3._12_4_;
        auVar40 = vfmsub231ps_fma(auVar20,auVar56,auVar45);
        auVar21._4_4_ = auVar45._4_4_ * auVar46._4_4_;
        auVar21._0_4_ = auVar45._0_4_ * auVar46._0_4_;
        auVar21._8_4_ = auVar45._8_4_ * auVar46._8_4_;
        auVar21._12_4_ = auVar45._12_4_ * auVar46._12_4_;
        auVar21._16_4_ = auVar45._16_4_ * auVar46._16_4_;
        auVar21._20_4_ = auVar45._20_4_ * auVar46._20_4_;
        auVar21._24_4_ = auVar45._24_4_ * auVar46._24_4_;
        auVar21._28_4_ = auVar42._12_4_;
        auVar41 = vfmsub231ps_fma(auVar21,auVar55,auVar43);
        auVar22._4_4_ = auVar43._4_4_ * auVar56._4_4_;
        auVar22._0_4_ = auVar43._0_4_ * auVar56._0_4_;
        auVar22._8_4_ = auVar43._8_4_ * auVar56._8_4_;
        auVar22._12_4_ = auVar43._12_4_ * auVar56._12_4_;
        auVar22._16_4_ = auVar43._16_4_ * auVar56._16_4_;
        auVar22._20_4_ = auVar43._20_4_ * auVar56._20_4_;
        auVar22._24_4_ = auVar43._24_4_ * auVar56._24_4_;
        auVar22._28_4_ = auVar13._12_4_;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar82._4_4_ = uVar1;
        auVar82._0_4_ = uVar1;
        auVar82._8_4_ = uVar1;
        auVar82._12_4_ = uVar1;
        auVar82._16_4_ = uVar1;
        auVar82._20_4_ = uVar1;
        auVar82._24_4_ = uVar1;
        auVar82._28_4_ = uVar1;
        auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
        auVar48 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar52._4_4_ = uVar1;
        auVar52._0_4_ = uVar1;
        auVar52._8_4_ = uVar1;
        auVar52._12_4_ = uVar1;
        auVar52._16_4_ = uVar1;
        auVar52._20_4_ = uVar1;
        auVar52._24_4_ = uVar1;
        auVar52._28_4_ = uVar1;
        auVar49 = vsubps_avx512vl(auVar49,auVar52);
        auVar2 = vfmsub231ps_fma(auVar22,auVar46,auVar44);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar53._4_4_ = uVar1;
        auVar53._0_4_ = uVar1;
        auVar53._8_4_ = uVar1;
        auVar53._12_4_ = uVar1;
        auVar53._16_4_ = uVar1;
        auVar53._20_4_ = uVar1;
        auVar53._24_4_ = uVar1;
        auVar53._28_4_ = uVar1;
        auVar50 = vsubps_avx512vl(auVar50,auVar53);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar54._4_4_ = uVar1;
        auVar54._0_4_ = uVar1;
        auVar54._8_4_ = uVar1;
        auVar54._12_4_ = uVar1;
        auVar54._16_4_ = uVar1;
        auVar54._20_4_ = uVar1;
        auVar54._24_4_ = uVar1;
        auVar54._28_4_ = uVar1;
        auVar51 = vsubps_avx512vl(auVar51,auVar54);
        auVar52 = vmulps_avx512vl(auVar47,auVar51);
        auVar52 = vfmsub231ps_avx512vl(auVar52,auVar50,auVar48);
        auVar53 = vmulps_avx512vl(auVar48,auVar49);
        auVar53 = vfmsub231ps_avx512vl(auVar53,auVar51,auVar82);
        auVar54 = vmulps_avx512vl(auVar82,auVar50);
        auVar54 = vfmsub231ps_avx512vl(auVar54,auVar49,auVar47);
        auVar48 = vmulps_avx512vl(ZEXT1632(auVar2),auVar48);
        auVar47 = vfmadd231ps_avx512vl(auVar48,ZEXT1632(auVar41),auVar47);
        local_1300 = vfmadd231ps_avx512vl(auVar47,ZEXT1632(auVar40),auVar82);
        auVar48._8_4_ = 0x7fffffff;
        auVar48._0_8_ = 0x7fffffff7fffffff;
        auVar48._12_4_ = 0x7fffffff;
        auVar48._16_4_ = 0x7fffffff;
        auVar48._20_4_ = 0x7fffffff;
        auVar48._24_4_ = 0x7fffffff;
        auVar48._28_4_ = 0x7fffffff;
        vandps_avx512vl(local_1300,auVar48);
        vandps_avx512vl(local_1300,auVar94._0_32_);
        auVar55 = vmulps_avx512vl(auVar55,auVar54);
        auVar56 = vfmadd231ps_avx512vl(auVar55,auVar53,auVar56);
        auVar46 = vfmadd231ps_avx512vl(auVar56,auVar52,auVar46);
        fVar81 = local_1300._0_4_;
        auVar75._0_4_ = (float)((uint)fVar81 ^ auVar46._0_4_);
        fVar83 = local_1300._4_4_;
        auVar75._4_4_ = (float)((uint)fVar83 ^ auVar46._4_4_);
        fVar84 = local_1300._8_4_;
        auVar75._8_4_ = (float)((uint)fVar84 ^ auVar46._8_4_);
        fVar85 = local_1300._12_4_;
        auVar75._12_4_ = (float)((uint)fVar85 ^ auVar46._12_4_);
        fVar86 = local_1300._16_4_;
        auVar75._16_4_ = (float)((uint)fVar86 ^ auVar46._16_4_);
        fVar87 = local_1300._20_4_;
        auVar75._20_4_ = (float)((uint)fVar87 ^ auVar46._20_4_);
        fVar88 = local_1300._24_4_;
        auVar75._24_4_ = (float)((uint)fVar88 ^ auVar46._24_4_);
        uStack_1264 = local_1300._28_4_;
        auVar75._28_4_ = (float)(uStack_1264 ^ auVar46._28_4_);
        auVar45 = vmulps_avx512vl(auVar45,auVar54);
        auVar44 = vfmadd231ps_avx512vl(auVar45,auVar44,auVar53);
        auVar43 = vfmadd231ps_avx512vl(auVar44,auVar43,auVar52);
        auVar80._0_4_ = (float)((uint)fVar81 ^ auVar43._0_4_);
        auVar80._4_4_ = (float)((uint)fVar83 ^ auVar43._4_4_);
        auVar80._8_4_ = (float)((uint)fVar84 ^ auVar43._8_4_);
        auVar80._12_4_ = (float)((uint)fVar85 ^ auVar43._12_4_);
        auVar80._16_4_ = (float)((uint)fVar86 ^ auVar43._16_4_);
        auVar80._20_4_ = (float)((uint)fVar87 ^ auVar43._20_4_);
        auVar80._24_4_ = (float)((uint)fVar88 ^ auVar43._24_4_);
        auVar80._28_4_ = (float)(uStack_1264 ^ auVar43._28_4_);
        uVar16 = vcmpps_avx512vl(auVar75,ZEXT832(0) << 0x20,5);
        uVar17 = vcmpps_avx512vl(auVar80,ZEXT832(0) << 0x20,5);
        uVar14 = vcmpps_avx512vl(local_1300,ZEXT832(0) << 0x20,4);
        auVar90._0_4_ = auVar75._0_4_ + auVar80._0_4_;
        auVar90._4_4_ = auVar75._4_4_ + auVar80._4_4_;
        auVar90._8_4_ = auVar75._8_4_ + auVar80._8_4_;
        auVar90._12_4_ = auVar75._12_4_ + auVar80._12_4_;
        auVar90._16_4_ = auVar75._16_4_ + auVar80._16_4_;
        auVar90._20_4_ = auVar75._20_4_ + auVar80._20_4_;
        auVar90._24_4_ = auVar75._24_4_ + auVar80._24_4_;
        auVar90._28_4_ = auVar75._28_4_ + auVar80._28_4_;
        uVar15 = vcmpps_avx512vl(auVar90,local_1300,2);
        local_12df = (byte)uVar16 & (byte)uVar17 & (byte)uVar14 & (byte)uVar15;
        if (local_12df != 0) {
          auVar23._4_4_ = auVar2._4_4_ * auVar51._4_4_;
          auVar23._0_4_ = auVar2._0_4_ * auVar51._0_4_;
          auVar23._8_4_ = auVar2._8_4_ * auVar51._8_4_;
          auVar23._12_4_ = auVar2._12_4_ * auVar51._12_4_;
          auVar23._16_4_ = auVar51._16_4_ * 0.0;
          auVar23._20_4_ = auVar51._20_4_ * 0.0;
          auVar23._24_4_ = auVar51._24_4_ * 0.0;
          auVar23._28_4_ = auVar51._28_4_;
          auVar3 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar41),auVar23);
          auVar3 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar40),ZEXT1632(auVar3));
          local_1320._0_4_ = (float)((uint)fVar81 ^ auVar3._0_4_);
          local_1320._4_4_ = (float)((uint)fVar83 ^ auVar3._4_4_);
          local_1320._8_4_ = (float)((uint)fVar84 ^ auVar3._8_4_);
          local_1320._12_4_ = (float)((uint)fVar85 ^ auVar3._12_4_);
          local_1320._16_4_ = fVar86;
          local_1320._20_4_ = fVar87;
          local_1320._24_4_ = fVar88;
          local_1320._28_4_ = uStack_1264;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar18._4_4_ = uVar1;
          auVar18._0_4_ = uVar1;
          auVar18._8_4_ = uVar1;
          auVar18._12_4_ = uVar1;
          auVar18._16_4_ = uVar1;
          auVar18._20_4_ = uVar1;
          auVar18._24_4_ = uVar1;
          auVar18._28_4_ = uVar1;
          auVar43 = vmulps_avx512vl(local_1300,auVar18);
          uVar16 = vcmpps_avx512vl(auVar43,local_1320,1);
          fVar89 = *(float *)(ray + k * 4 + 0x80);
          auVar24._4_4_ = fVar89 * fVar83;
          auVar24._0_4_ = fVar89 * fVar81;
          auVar24._8_4_ = fVar89 * fVar84;
          auVar24._12_4_ = fVar89 * fVar85;
          auVar24._16_4_ = fVar89 * fVar86;
          auVar24._20_4_ = fVar89 * fVar87;
          auVar24._24_4_ = fVar89 * fVar88;
          auVar24._28_4_ = auVar43._28_4_;
          uVar17 = vcmpps_avx512vl(local_1320,auVar24,2);
          local_12df = (byte)uVar16 & (byte)uVar17 & local_12df;
          if (local_12df != 0) {
            auVar43 = vsubps_avx(local_1300,auVar80);
            local_1360 = vblendps_avx(auVar75,auVar43,0xf0);
            auVar43 = vsubps_avx(local_1300,auVar75);
            local_1340 = vblendps_avx(auVar80,auVar43,0xf0);
            fVar74 = (float)DAT_01fbac00;
            local_1260._0_4_ = fVar74 * auVar40._0_4_;
            fVar76 = DAT_01fbac00._4_4_;
            local_1260._4_4_ = fVar76 * auVar40._4_4_;
            fVar60 = DAT_01fbac00._8_4_;
            local_1260._8_4_ = fVar60 * auVar40._8_4_;
            fVar64 = DAT_01fbac00._12_4_;
            local_1260._12_4_ = fVar64 * auVar40._12_4_;
            fVar65 = DAT_01fbac00._16_4_;
            local_1260._16_4_ = fVar65 * 0.0;
            fVar66 = DAT_01fbac00._20_4_;
            local_1260._20_4_ = fVar66 * 0.0;
            fVar77 = DAT_01fbac00._24_4_;
            local_1260._24_4_ = fVar77 * 0.0;
            local_1260._28_4_ = 0;
            local_1240._4_4_ = fVar76 * auVar41._4_4_;
            local_1240._0_4_ = fVar74 * auVar41._0_4_;
            local_1240._8_4_ = fVar60 * auVar41._8_4_;
            local_1240._12_4_ = fVar64 * auVar41._12_4_;
            local_1240._16_4_ = fVar65 * 0.0;
            local_1240._20_4_ = fVar66 * 0.0;
            local_1240._24_4_ = fVar77 * 0.0;
            local_1240._28_4_ = 0;
            local_1220._4_4_ = fVar76 * auVar2._4_4_;
            local_1220._0_4_ = fVar74 * auVar2._0_4_;
            local_1220._8_4_ = fVar60 * auVar2._8_4_;
            local_1220._12_4_ = fVar64 * auVar2._12_4_;
            local_1220._16_4_ = fVar65 * 0.0;
            local_1220._20_4_ = fVar66 * 0.0;
            local_1220._24_4_ = fVar77 * 0.0;
            local_1220._28_4_ = 0;
            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01dcadc5:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_01dcadd6;
              }
              auVar69._8_4_ = 1;
              auVar69._0_8_ = 0x100000001;
              auVar69._12_4_ = 1;
              auVar69._16_4_ = 1;
              auVar69._20_4_ = 1;
              auVar69._24_4_ = 1;
              auVar69._28_4_ = 1;
              auVar43 = vpermd_avx2(auVar69,ZEXT1632(auVar5));
              auVar44 = vpaddd_avx2(auVar43,_DAT_01fb7760);
              auVar59._0_4_ = auVar5._0_4_;
              auVar59._4_4_ = auVar59._0_4_;
              auVar59._8_4_ = auVar59._0_4_;
              auVar59._12_4_ = auVar59._0_4_;
              auVar59._16_4_ = auVar59._0_4_;
              auVar59._20_4_ = auVar59._0_4_;
              auVar59._24_4_ = auVar59._0_4_;
              auVar59._28_4_ = auVar59._0_4_;
              auVar43 = vpaddd_avx2(auVar59,_DAT_01fb7740);
              auVar40 = vcvtsi2ss_avx512f(auVar91._0_16_,*(ushort *)(lVar7 + 8 + lVar31) - 1);
              auVar11._12_4_ = 0;
              auVar11._0_12_ = ZEXT812(0);
              auVar41 = vrcp14ss_avx512f(auVar11 << 0x20,ZEXT416(auVar40._0_4_));
              auVar40 = vfnmadd213ss_fma(auVar40,auVar41,SUB6416(ZEXT464(0x40000000),0));
              fVar74 = auVar41._0_4_ * auVar40._0_4_;
              auVar40 = vcvtsi2ss_avx512f(auVar91._0_16_,*(ushort *)(lVar7 + 10 + lVar31) - 1);
              auVar41 = vrcp14ss_avx512f(auVar11 << 0x20,ZEXT416(auVar40._0_4_));
              auVar40 = vfnmadd213ss_fma(auVar40,auVar41,SUB6416(ZEXT464(0x40000000),0));
              fVar76 = auVar41._0_4_ * auVar40._0_4_;
              auVar43 = vcvtdq2ps_avx(auVar43);
              fStack_12a4 = auVar43._28_4_ + local_1360._28_4_;
              auVar44 = vcvtdq2ps_avx(auVar44);
              auVar45 = vrcp14ps_avx512vl(local_1300);
              auVar19._8_4_ = 0x3f800000;
              auVar19._0_8_ = 0x3f8000003f800000;
              auVar19._12_4_ = 0x3f800000;
              auVar19._16_4_ = 0x3f800000;
              auVar19._20_4_ = 0x3f800000;
              auVar19._24_4_ = 0x3f800000;
              auVar19._28_4_ = 0x3f800000;
              auVar46 = vfnmadd213ps_avx512vl(local_1300,auVar45,auVar19);
              auVar40 = vfmadd132ps_fma(auVar46,auVar45,auVar45);
              fVar60 = auVar40._0_4_;
              fVar64 = auVar40._4_4_;
              fVar65 = auVar40._8_4_;
              fVar66 = auVar40._12_4_;
              local_1280[0] = fVar60 * local_1320._0_4_;
              local_1280[1] = fVar64 * local_1320._4_4_;
              local_1280[2] = fVar65 * local_1320._8_4_;
              local_1280[3] = fVar66 * local_1320._12_4_;
              fStack_1270 = fVar86 * 0.0;
              fStack_126c = fVar87 * 0.0;
              fStack_1268 = fVar88 * 0.0;
              local_12c0[0] = (fVar81 * auVar43._0_4_ + local_1360._0_4_) * fVar74 * fVar60;
              local_12c0[1] = (fVar83 * auVar43._4_4_ + local_1360._4_4_) * fVar74 * fVar64;
              local_12c0[2] = (fVar84 * auVar43._8_4_ + local_1360._8_4_) * fVar74 * fVar65;
              local_12c0[3] = (fVar85 * auVar43._12_4_ + local_1360._12_4_) * fVar74 * fVar66;
              fStack_12b0 = (fVar86 * auVar43._16_4_ + local_1360._16_4_) * fVar74 * 0.0;
              fStack_12ac = (fVar87 * auVar43._20_4_ + local_1360._20_4_) * fVar74 * 0.0;
              fStack_12a8 = (fVar88 * auVar43._24_4_ + local_1360._24_4_) * fVar74 * 0.0;
              local_12a0[0] = (fVar81 * auVar44._0_4_ + local_1340._0_4_) * fVar76 * fVar60;
              local_12a0[1] = (fVar83 * auVar44._4_4_ + local_1340._4_4_) * fVar76 * fVar64;
              local_12a0[2] = (fVar84 * auVar44._8_4_ + local_1340._8_4_) * fVar76 * fVar65;
              local_12a0[3] = (fVar85 * auVar44._12_4_ + local_1340._12_4_) * fVar76 * fVar66;
              fStack_1290 = (fVar86 * auVar44._16_4_ + local_1340._16_4_) * fVar76 * 0.0;
              fStack_128c = (fVar87 * auVar44._20_4_ + local_1340._20_4_) * fVar76 * 0.0;
              fStack_1288 = (fVar88 * auVar44._24_4_ + local_1340._24_4_) * fVar76 * 0.0;
              fStack_1284 = fStack_12a4;
              uVar33 = 0;
              uVar35 = (ulong)local_12df;
              for (uVar34 = uVar35; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                uVar33 = uVar33 + 1;
              }
              auVar40 = vpbroadcastd_avx512vl();
              local_1530 = vpbroadcastd_avx512vl();
              local_1420 = auVar91._0_32_;
              local_1440 = auVar92._0_32_;
              local_1460 = auVar93._0_32_;
              local_1480 = auVar95._0_32_;
              local_14a0 = auVar96._0_32_;
              local_14c0 = auVar97._0_32_;
              local_14e0 = vmovdqa64_avx512vl(auVar98._0_32_);
              local_1500 = vmovdqa64_avx512vl(auVar99._0_32_);
              local_1570 = vmovdqa64_avx512vl(auVar101._0_16_);
              local_1520 = fVar89;
              fStack_151c = fVar89;
              fStack_1518 = fVar89;
              fStack_1514 = fVar89;
              fStack_1510 = fVar89;
              fStack_150c = fVar89;
              fStack_1508 = fVar89;
              fStack_1504 = fVar89;
              while (uVar35 != 0) {
                local_13c0 = local_12c0[uVar33];
                local_13b0 = local_12a0[uVar33];
                *(float *)(ray + k * 4 + 0x80) = local_1280[uVar33];
                local_1560.context = context->user;
                local_13f0 = *(undefined4 *)(local_1260 + uVar33 * 4);
                local_13e0 = *(undefined4 *)(local_1240 + uVar33 * 4);
                local_13d0 = *(undefined4 *)(local_1220 + uVar33 * 4);
                local_13a0 = local_1530._0_8_;
                uStack_1398 = local_1530._8_8_;
                vpcmpeqd_avx2(ZEXT1632(auVar40),ZEXT1632(auVar40));
                uStack_137c = (local_1560.context)->instID[0];
                local_1380 = uStack_137c;
                uStack_1378 = uStack_137c;
                uStack_1374 = uStack_137c;
                auStack_1370._4_4_ = (local_1560.context)->instPrimID[0];
                auStack_1370._0_4_ = auStack_1370._4_4_;
                auStack_1370._8_4_ = auStack_1370._4_4_;
                auStack_1370._12_4_ = auStack_1370._4_4_;
                local_1600 = vmovdqa64_avx512vl(auVar101._0_16_);
                local_1560.valid = (int *)local_1600;
                local_1560.geometryUserPtr = pGVar6->userPtr;
                local_1560.hit = (RTCHitN *)&local_13f0;
                local_1560.N = 4;
                auVar41 = vmovdqa64_avx512vl(auVar101._0_16_);
                local_1560.ray = (RTCRayN *)ray;
                uStack_13ec = local_13f0;
                uStack_13e8 = local_13f0;
                uStack_13e4 = local_13f0;
                uStack_13dc = local_13e0;
                uStack_13d8 = local_13e0;
                uStack_13d4 = local_13e0;
                uStack_13cc = local_13d0;
                uStack_13c8 = local_13d0;
                uStack_13c4 = local_13d0;
                fStack_13bc = local_13c0;
                fStack_13b8 = local_13c0;
                fStack_13b4 = local_13c0;
                fStack_13ac = local_13b0;
                fStack_13a8 = local_13b0;
                fStack_13a4 = local_13b0;
                local_1390 = auVar40;
                if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar6->occlusionFilterN)(&local_1560);
                  auVar41 = vmovdqa64_avx512vl(local_1570);
                  auVar101 = ZEXT1664(auVar41);
                  auVar41 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                  auVar100 = ZEXT1664(auVar41);
                  auVar43 = vmovdqa64_avx512vl(local_1500);
                  auVar99 = ZEXT3264(auVar43);
                  auVar43 = vmovdqa64_avx512vl(local_14e0);
                  auVar98 = ZEXT3264(auVar43);
                  auVar97 = ZEXT3264(local_14c0);
                  auVar96 = ZEXT3264(local_14a0);
                  auVar95 = ZEXT3264(local_1480);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar94 = ZEXT3264(auVar43);
                  auVar93 = ZEXT3264(local_1460);
                  auVar92 = ZEXT3264(local_1440);
                  auVar91 = ZEXT3264(local_1420);
                  auVar41 = local_1600;
                  fVar89 = local_1520;
                }
                uVar34 = vptestmd_avx512vl(auVar41,auVar41);
                if ((uVar34 & 0xf) != 0) {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var9)(&local_1560);
                    auVar41 = vmovdqa64_avx512vl(local_1570);
                    auVar101 = ZEXT1664(auVar41);
                    auVar41 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                    auVar100 = ZEXT1664(auVar41);
                    auVar43 = vmovdqa64_avx512vl(local_1500);
                    auVar99 = ZEXT3264(auVar43);
                    auVar43 = vmovdqa64_avx512vl(local_14e0);
                    auVar98 = ZEXT3264(auVar43);
                    auVar97 = ZEXT3264(local_14c0);
                    auVar96 = ZEXT3264(local_14a0);
                    auVar95 = ZEXT3264(local_1480);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar94 = ZEXT3264(auVar43);
                    auVar93 = ZEXT3264(local_1460);
                    auVar92 = ZEXT3264(local_1440);
                    auVar91 = ZEXT3264(local_1420);
                    auVar41 = local_1600;
                    fVar89 = local_1520;
                  }
                  auVar2 = *(undefined1 (*) [16])(local_1560.ray + 0x80);
                  uVar34 = vptestmd_avx512vl(auVar41,auVar41);
                  uVar34 = uVar34 & 0xf;
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar10 = (bool)((byte)uVar34 & 1);
                  auVar42._0_4_ = (uint)bVar10 * auVar41._0_4_ | (uint)!bVar10 * auVar2._0_4_;
                  bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
                  auVar42._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar2._4_4_;
                  bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
                  auVar42._8_4_ = (uint)bVar10 * auVar41._8_4_ | (uint)!bVar10 * auVar2._8_4_;
                  bVar10 = SUB81(uVar34 >> 3,0);
                  auVar42._12_4_ = (uint)bVar10 * auVar41._12_4_ | (uint)!bVar10 * auVar2._12_4_;
                  *(undefined1 (*) [16])(local_1560.ray + 0x80) = auVar42;
                  if ((byte)uVar34 != 0) goto LAB_01dcadc5;
                }
                *(float *)(ray + k * 4 + 0x80) = fVar89;
                uVar34 = uVar33 & 0x3f;
                uVar33 = 0;
                uVar35 = uVar35 ^ 1L << uVar34;
                for (uVar34 = uVar35; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
                {
                  uVar33 = uVar33 + 1;
                }
              }
            }
          }
        }
      }
      unaff_R12 = 0;
      uVar32 = local_15c0;
      uVar33 = local_15c8;
      uVar34 = local_15d0;
      uVar35 = local_15d8;
      uVar36 = local_15e0;
      uVar39 = local_15e8;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }